

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AddTargetAlias
          (cmGlobalNinjaGenerator *this,string *alias,cmGeneratorTarget *target)

{
  mapped_type *ppcVar1;
  pointer __k;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>,_bool>
  pVar2;
  cmNinjaDeps outputs;
  string buildAlias;
  cmNinjaDeps local_88;
  string local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>
  local_48;
  
  NinjaOutputPath(&local_68,this,alias);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AppendTargetOutputs(this,target,&local_88,DependOnTargetArtifact);
  for (__k = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    ppcVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget_*>_>_>
              ::operator[](&this->TargetAliases,__k);
    *ppcVar1 = (mapped_type)0x0;
  }
  std::__cxx11::string::string((string *)&local_48,(string *)&local_68);
  local_48.second = target;
  pVar2 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmGeneratorTarget*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget*>>>
                      *)&this->TargetAliases,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if ((((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
     (*(cmGeneratorTarget **)(pVar2.first._M_node._M_node + 2) != target)) {
    *(undefined8 *)(pVar2.first._M_node._M_node + 2) = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddTargetAlias(const std::string& alias,
                                            cmGeneratorTarget* target)
{
  std::string buildAlias = this->NinjaOutputPath(alias);
  cmNinjaDeps outputs;
  this->AppendTargetOutputs(target, outputs);
  // Mark the target's outputs as ambiguous to ensure that no other target uses
  // the output as an alias.
  for (cmNinjaDeps::iterator i = outputs.begin(); i != outputs.end(); ++i) {
    TargetAliases[*i] = CM_NULLPTR;
  }

  // Insert the alias into the map.  If the alias was already present in the
  // map and referred to another target, mark it as ambiguous.
  std::pair<TargetAliasMap::iterator, bool> newAlias =
    TargetAliases.insert(std::make_pair(buildAlias, target));
  if (newAlias.second && newAlias.first->second != target) {
    newAlias.first->second = CM_NULLPTR;
  }
}